

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O1

long __thiscall cpp_client::Base_game::go(Base_game *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_> _Var2;
  uint uVar3;
  long lVar4;
  uint __val;
  uint uVar5;
  int iVar6;
  long *plVar7;
  size_type *extraout_RAX;
  size_type *extraout_RAX_00;
  size_type *psVar8;
  uint uVar9;
  size_type *psVar10;
  _Alloc_hider *__n;
  Any *pAVar11;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer __buf;
  ulong uVar12;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_00;
  int __flags;
  uint __len;
  char *__end;
  string to_send;
  anon_class_8_1_3e8781ac add_standard_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> game_name;
  string alias;
  undefined1 local_f0 [32];
  string local_d0;
  anon_class_8_1_3e8781ac local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  long local_98 [2];
  undefined1 local_88 [32];
  undefined8 local_68;
  _Alloc_hider local_60;
  _Alloc_hider local_58;
  undefined1 auStack_50 [8];
  undefined1 local_48 [16];
  
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[10])(&local_d0);
  __flags = 0x1c;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x12c0b8);
  psVar8 = (size_type *)(local_88 + 0x10);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    local_88._16_8_ = *psVar10;
    local_88._24_8_ = plVar7[3];
    local_88._0_8_ = psVar8;
  }
  else {
    local_88._16_8_ = *psVar10;
    local_88._0_8_ = (size_type *)*plVar7;
  }
  local_88._8_8_ = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_88);
  local_68 = &local_58;
  __n = (_Alloc_hider *)(plVar7 + 2);
  if ((_Alloc_hider *)*plVar7 == __n) {
    local_58._M_p = __n->_M_p;
    auStack_50 = (undefined1  [8])plVar7[3];
  }
  else {
    local_58._M_p = __n->_M_p;
    local_68 = (_Alloc_hider *)*plVar7;
  }
  __buf = (pointer)plVar7[1];
  *plVar7 = (long)__n;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_60._M_p = __buf;
  if ((size_type *)local_88._0_8_ != psVar8) {
    operator_delete((void *)local_88._0_8_);
    __buf = extraout_RDX;
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
    __buf = extraout_RDX_00;
  }
  Connection::send(&this->conn_,(int)&local_68,__buf,(size_t)__n,__flags);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"named","");
  handle_response((Base_game *)local_f0,(string *)this);
  plVar7 = (long *)(**(code **)(*(long *)*(unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                                           *)local_f0._0_8_ + 0x18))();
  local_88._0_8_ = psVar8;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,*plVar7,plVar7[1] + *plVar7);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "{\"event\": \"play\", \"data\": {\"clientType\": \"c++\", \"playerIndex\": ","");
  uVar3 = this->player_index_;
  if (uVar3 == 0xffffffff) {
    std::__cxx11::string::append((char *)&local_d0);
  }
  else {
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar12 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar9 = (uint)uVar12;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0011841e;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0011841e;
        }
        if (uVar9 < 10000) goto LAB_0011841e;
        uVar12 = uVar12 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0011841e:
    local_a8._M_allocated_capacity = (size_type)local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((uVar3 >> 0x1f) + local_a8._M_allocated_capacity),__len,__val);
    plVar7 = (long *)std::__cxx11::string::append(local_a8._M_local_buf);
    pAVar11 = (Any *)(plVar7 + 2);
    if ((Any *)*plVar7 == pAVar11) {
      local_f0._16_8_ =
           (pAVar11->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      local_f0._24_8_ = plVar7[3];
      local_f0._0_8_ = (Any *)(local_f0 + 0x10);
    }
    else {
      local_f0._16_8_ =
           (pAVar11->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      local_f0._0_8_ = (Any *)*plVar7;
    }
    local_f0._8_8_ =
         ((_Tuple_impl<0UL,_cpp_client::Delta_mergable_delay_variables_*,_std::default_delete<cpp_client::Delta_mergable_delay_variables>_>
           *)(plVar7 + 1))->
         super__Head_base<0UL,_cpp_client::Delta_mergable_delay_variables_*,_false>;
    *plVar7 = (long)pAVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_d0,local_f0._0_8_);
    if ((Any *)local_f0._0_8_ != (Any *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_);
    }
    if ((long *)local_a8._M_allocated_capacity != local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
  }
  local_b0.to_send = &local_d0;
  _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl =
       (_Head_base<0UL,_cpp_client::Any_*,_false>)((long)local_f0 + 0x10);
  local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"password","");
  go::anon_class_8_1_3e8781ac::operator()(&local_b0,(string *)local_f0,&this->password_);
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"requestedSession","");
  go::anon_class_8_1_3e8781ac::operator()(&local_b0,(string *)local_f0,&this->session_);
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"gameSettings","");
  go::anon_class_8_1_3e8781ac::operator()(&local_b0,(string *)local_f0,&this->game_settings_);
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
  }
  std::__cxx11::string::append((char *)&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&this->name_);
  if (iVar6 == 0) {
    (**((this->ai_)._M_t.
        super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>._M_t.
        super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
        super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl)->_vptr_Base_ai)(local_f0);
    std::__cxx11::string::_M_append((char *)&local_d0,local_f0._0_8_);
    if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
        _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
      operator_delete((void *)local_f0._0_8_);
    }
  }
  else {
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(this->name_)._M_dataplus._M_p);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                 "\",\"gameName\":\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  plVar7 = (long *)std::__cxx11::string::append(local_a8._M_local_buf);
  pAVar11 = (Any *)(plVar7 + 2);
  if ((Any *)*plVar7 == pAVar11) {
    local_f0._16_8_ =
         (pAVar11->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    local_f0._24_8_ = plVar7[3];
    local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  }
  else {
    local_f0._16_8_ =
         (pAVar11->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    local_f0._0_8_ = (Any *)*plVar7;
  }
  local_f0._8_8_ = plVar7[1];
  *plVar7 = (long)pAVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_d0,local_f0._0_8_);
  __buf_00 = extraout_RDX_01;
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
    __buf_00 = extraout_RDX_02;
  }
  if ((long *)local_a8._M_allocated_capacity != local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity);
    __buf_00 = extraout_RDX_03;
  }
  Connection::send(&this->conn_,(int)&local_d0,__buf_00,(size_t)pAVar11,__flags);
  local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"lobbied","");
  handle_response((Base_game *)&stack0xffffffffffffffc8,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)
             &stack0xffffffffffffffc8);
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"delta","");
  handle_response((Base_game *)(local_48 + 8),(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)(local_48 + 8));
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"start","");
  handle_response((Base_game *)local_48,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_48);
  if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
      _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
    operator_delete((void *)local_f0._0_8_);
  }
  do {
    local_f0._0_8_ = _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"","");
    handle_response((Base_game *)&local_a8,(string *)this);
    lVar4 = *(long *)local_a8._M_allocated_capacity;
    std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
              ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)
               &local_a8._M_allocated_capacity);
    if ((_Head_base<0UL,_cpp_client::Any_*,_false>)local_f0._0_8_ !=
        _Var2.super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl) {
      operator_delete((void *)local_f0._0_8_);
    }
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  psVar8 = (size_type *)(local_88 + 0x10);
  if ((size_type *)local_88._0_8_ != psVar8) {
    operator_delete((void *)local_88._0_8_);
    psVar8 = extraout_RAX;
  }
  if ((_Alloc_hider *)local_68 != &local_58) {
    operator_delete((void *)local_68);
    psVar8 = extraout_RAX_00;
  }
  return (long)psVar8;
}

Assistant:

void Base_game::go()
{
   //grab the name first (do this again to ensure proper server-side name)
   std::string alias = R"({"event": "alias", "data": ")" + get_game_name() + "\"}";
   conn_.send(alias);
   const auto game_name = handle_response("named")->as<std::string>();
   //start with the same thing each time
   std::string to_send = R"({"event": "play", "data": {"clientType": "c++", "playerIndex": )";
   //now fill in the details
   if(player_index_ == -1)
   {
      to_send += "null,";
   }
   else
   {
      to_send += std::to_string(player_index_) + ",";
   }
   const auto add_standard_str = [&to_send](const std::string& name, const std::string& to_add)
      {
         to_send += "\"" + name + "\":";
         if(to_add == "")
         {
            to_send += "null,";
         }
         else
         {
            to_send += "\"" + to_add + "\",";
         }
      };
   add_standard_str("password", password_);
   add_standard_str("requestedSession", session_);
   add_standard_str("gameSettings", game_settings_);
   to_send += R"("playerName":")";
   if(name_ == "")
   {
      to_send += ai_->get_name();
   }
   else
   {
      to_send += name_;
   }
   to_send += R"(","gameName":")" + game_name + R"("}})";
   conn_.send(to_send);
   //Expecting the "lobbied" message
   handle_response("lobbied");
   //Next the delta message will be received
   handle_response("delta");
   //Start should be next
   handle_response("start");
   //now just do normal handling of events
   while(*handle_response())
   {
      //Intentionally empty
   }
}